

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.cpp
# Opt level: O2

void __thiscall
duckdb::ConnectionManager::AddConnection(ConnectionManager *this,ClientContext *context)

{
  pointer puVar1;
  DatabaseInstance *pDVar2;
  pointer pEVar3;
  mapped_type *this_00;
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
  *callback;
  pointer this_01;
  __shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  weak_ptr<duckdb::ClientContext,_true> local_38;
  key_type local_28;
  
  ::std::mutex::lock(&this->connections_lock);
  pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  puVar1 = (pDVar2->config).extension_callbacks.
           super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (pDVar2->config).extension_callbacks.
                 super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1; this_01 = this_01 + 1
      ) {
    pEVar3 = unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
             ::operator->(this_01);
    (**(code **)(*(long *)pEVar3 + 0x10))(pEVar3,context);
  }
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this
            ((enable_shared_from_this<duckdb::ClientContext> *)&_Stack_48);
  ::std::__weak_ptr<duckdb::ClientContext,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<duckdb::ClientContext,void>
            ((__weak_ptr<duckdb::ClientContext,(__gnu_cxx::_Lock_policy)2> *)&local_38,&_Stack_48);
  local_28._M_data = context;
  this_00 = ::std::__detail::
            _Map_base<std::reference_wrapper<duckdb::ClientContext>,_std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::ClientContext>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::reference_wrapper<duckdb::ClientContext>,_std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::ClientContext>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->connections,&local_28);
  weak_ptr<duckdb::ClientContext,_true>::operator=(this_00,&local_38);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_38.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  LOCK();
  (this->connection_count).super___atomic_base<unsigned_long>._M_i =
       (this->connections)._M_h._M_element_count;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void ConnectionManager::AddConnection(ClientContext &context) {
	lock_guard<mutex> lock(connections_lock);
	for (auto &callback : DBConfig::GetConfig(context).extension_callbacks) {
		callback->OnConnectionOpened(context);
	}
	connections[context] = weak_ptr<ClientContext>(context.shared_from_this());
	connection_count = connections.size();
}